

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_MeshComponentRef * __thiscall ON_Mesh::MeshComponent(ON_Mesh *this,ON_COMPONENT_INDEX ci)

{
  bool bVar1;
  ON_MeshComponentRef *this_00;
  ON_COMPONENT_INDEX ci_local;
  ON_MeshComponentRef cr;
  ON_COMPONENT_INDEX local_18;
  
  ci_local = ci;
  MeshComponentRef(&cr,this,ci);
  if (cr.m_mesh == this) {
    local_18 = ON_MeshComponentRef::ComponentIndex(&cr);
    bVar1 = ON_COMPONENT_INDEX::operator==(&local_18,&ci_local);
    if (bVar1) {
      this_00 = (ON_MeshComponentRef *)operator_new(0x20);
      ON_MeshComponentRef::ON_MeshComponentRef(this_00,&cr);
      goto LAB_00524fe0;
    }
  }
  this_00 = (ON_MeshComponentRef *)0x0;
LAB_00524fe0:
  ON_MeshComponentRef::~ON_MeshComponentRef(&cr);
  return this_00;
}

Assistant:

ON_MeshComponentRef* ON_Mesh::MeshComponent( 
  ON_COMPONENT_INDEX ci
  ) const
{
  ON_MeshComponentRef* cr_ptr = 0;
  ON_MeshComponentRef cr = MeshComponentRef(ci);
  if ( this == cr.Mesh() && cr.ComponentIndex() == ci )
    cr_ptr = new ON_MeshComponentRef(cr);
  return cr_ptr;
}